

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hh
# Opt level: O2

GameResult * __thiscall Game::play(Game *this)

{
  State *this_00;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *puVar1;
  int *piVar2;
  Ghost_State *ghost_00;
  char cVar3;
  Position PVar4;
  pointer ppAVar5;
  Agent *pAVar6;
  pointer pGVar7;
  pointer piVar8;
  pointer piVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  Ghost_State *ghost;
  ostream *poVar13;
  int extraout_var;
  ulong uVar14;
  int extraout_var_00;
  pointer pGVar15;
  int *piVar16;
  long lVar17;
  int i;
  long lVar18;
  char *pcVar19;
  int i_1;
  float fVar20;
  float fVar21;
  Position next_pos;
  vector<Position,_std::allocator<Position>_> ghost_previous_pos;
  vector<int,_std::allocator<int>_> ghosts_pos;
  char str [200];
  
  if (this->loaded_maze == false) {
    builtin_strncpy(str,"Try to play without a loaded maze",0x22);
    poVar13 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar13 = std::operator<<(poVar13,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                             );
    poVar13 = std::operator<<(poVar13,"][");
    poVar13 = std::operator<<(poVar13,"play");
    poVar13 = std::operator<<(poVar13,"][Line ");
    iVar12 = 0xab;
  }
  else {
    if (this->pacman != (Agent *)0x0) {
      if (Arguments::plays == 1) {
        poVar13 = operator<<((ostream *)&std::cout,&this->state);
        std::endl<char,std::char_traits<char>>(poVar13);
      }
      this_00 = &this->state;
      puVar1 = &(this->state).pills;
      while (iVar12 = (this->state).n_normal_pills_left, piVar16 = &(this->state).n_powerpills_left,
            iVar11 = iVar12 + *piVar16, iVar11 != 0 && SCARRY4(iVar12,*piVar16) == iVar11 < 0) {
        if (Arguments::plays == 1) {
          std::ostream::flush();
          usleep((__useconds_t)(long)Arguments::visualization_speed);
        }
        update_ghost_states(this);
        piVar16 = &(this->state).round;
        *piVar16 = *piVar16 + 1;
        iVar12 = (this->state).n_rounds_powerpill;
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        (this->state).n_rounds_powerpill = iVar12 + -1;
        iVar12 = (**this->pacman->_vptr_Agent)(this->pacman,this_00,0);
        PVar4 = (this->state).pacman.pos;
        std::vector<Position,_std::allocator<Position>_>::vector
                  (&ghost_previous_pos,(long)State::n_ghosts,(allocator_type *)str);
        pGVar15 = (this->state).ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = (long)State::n_ghosts;
        for (lVar18 = 0; lVar18 < lVar17; lVar18 = lVar18 + 1) {
          ghost_previous_pos.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18] = (pGVar15->super_Agent_State).pos;
          pGVar15 = pGVar15 + 1;
        }
        if (((this->state).pacman.dir.i == iVar12) && ((this->state).pacman.dir.j == extraout_var))
        {
          fVar20 = Arguments::pacman_speed + (this->state).pacman.step;
          (this->state).pacman.step = fVar20;
          if (1.0 <= fVar20) {
            (this->state).pacman.step = fVar20 + -1.0;
            uVar14 = (long)iVar12 + (long)(this->state).pacman.pos.i;
            lVar17 = (long)extraout_var + (long)(this->state).pacman.pos.j;
            next_pos = (Position)(uVar14 & 0xffffffff | lVar17 << 0x20);
            cVar3 = *(char *)(*(long *)&(this->state).maze.t.
                                        super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data + lVar17);
            if (cVar3 != '%') {
              if (cVar3 == 'X') {
                builtin_strncpy(str,"Pacman crashes with spawn area",0x1f);
                poVar13 = std::operator<<((ostream *)&std::cout,"Debug[");
                poVar13 = std::operator<<(poVar13,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                         );
                poVar13 = std::operator<<(poVar13,"][");
                poVar13 = std::operator<<(poVar13,"play");
                poVar13 = std::operator<<(poVar13,"][Line ");
                poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0xd2);
                poVar13 = std::operator<<(poVar13,"] ");
                poVar13 = std::operator<<(poVar13,str);
                std::endl<char,std::char_traits<char>>(poVar13);
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                              ,0xd3,"GameResult &Game::play()");
              }
              (this->state).pacman.pos.i = (int)uVar14;
              (this->state).pacman.pos.j = (int)lVar17;
              State::ghosts_in_position(&ghosts_pos,this_00,&next_pos);
              piVar8 = ghosts_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              piVar9 = ghosts_pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
LAB_00108d40:
              piVar16 = piVar9;
              if (piVar16 != piVar8) goto code_r0x00108d4c;
              if (cVar3 != ' ') {
                if (cVar3 == 'o') {
                  *(undefined1 *)
                   (*(long *)&(this->state).maze.t.
                              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[next_pos.i].
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data + (long)next_pos.j) = 0x20;
                  piVar2 = &(this->state).n_powerpills_left;
                  *piVar2 = *piVar2 + -1;
                  str._0_4_ = PathMagic::index_from_pos.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[next_pos.i].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[next_pos.j];
                  std::
                  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::_M_erase(&puVar1->_M_h,str);
                  str._0_4_ = PathMagic::index_from_pos.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[next_pos.i].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[next_pos.j];
                  std::
                  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::_M_erase(&(this->state).powerpills._M_h,str);
                  (*this->pacman->_vptr_Agent[3])();
                  pGVar7 = (this->state).ghosts.
                           super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  for (pGVar15 = (this->state).ghosts.
                                 super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
                                 _M_impl.super__Vector_impl_data._M_start; pGVar15 != pGVar7;
                      pGVar15 = pGVar15 + 1) {
                    pGVar15->maybe_scared = true;
                  }
                  (this->state).n_rounds_powerpill = Arguments::n_rounds_powerpill;
                }
                else {
                  if (cVar3 != '.') {
                    sprintf(str,"Invalid cell_content character \'%c\'",(ulong)(uint)(int)cVar3);
                    poVar13 = std::operator<<((ostream *)&std::cout,"Error[");
                    poVar13 = std::operator<<(poVar13,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                             );
                    poVar13 = std::operator<<(poVar13,"][");
                    poVar13 = std::operator<<(poVar13,"play");
                    poVar13 = std::operator<<(poVar13,"][Line ");
                    poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0xf1);
                    poVar13 = std::operator<<(poVar13,"] ");
                    poVar13 = std::operator<<(poVar13,str);
                    std::endl<char,std::char_traits<char>>(poVar13);
                    goto LAB_00109498;
                  }
                  *(undefined1 *)
                   (*(long *)&(this->state).maze.t.
                              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[next_pos.i].
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data + (long)next_pos.j) = 0x20;
                  piVar2 = &(this->state).n_normal_pills_left;
                  *piVar2 = *piVar2 + -1;
                  str._0_4_ = PathMagic::index_from_pos.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[next_pos.i].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[next_pos.j];
                  std::
                  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::_M_erase(&puVar1->_M_h,str);
                  (*this->pacman->_vptr_Agent[2])();
                }
              }
              goto LAB_001091f9;
            }
            builtin_strncpy(str,"Pacman crashes with wall",0x19);
            poVar13 = std::operator<<((ostream *)&std::cout,"Debug[");
            poVar13 = std::operator<<(poVar13,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                     );
            poVar13 = std::operator<<(poVar13,"][");
            poVar13 = std::operator<<(poVar13,"play");
            poVar13 = std::operator<<(poVar13,"][Line ");
            poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0xcf);
            poVar13 = std::operator<<(poVar13,"] ");
            poVar13 = std::operator<<(poVar13,str);
            std::endl<char,std::char_traits<char>>(poVar13);
          }
        }
        else {
          (*this->pacman->_vptr_Agent[5])();
          (this->state).pacman.step = (1.0 - (this->state).pacman.step) * Arguments::pacman_speed;
          (this->state).pacman.dir.i = iVar12;
          (this->state).pacman.dir.j = extraout_var;
        }
LAB_00108dab:
        lVar17 = 0;
        uVar14 = 0;
        while( true ) {
          iVar12 = (this->state).round / Arguments::n_rounds_between_ghosts_start + 1;
          ppAVar5 = (this->ghosts).super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar11 = (int)((ulong)((long)(this->ghosts).
                                       super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl
                                       .super__Vector_impl_data._M_finish - (long)ppAVar5) >> 3);
          if (iVar11 <= iVar12) {
            iVar12 = iVar11;
          }
          if ((long)iVar12 <= (long)uVar14) break;
          pGVar15 = (this->state).ghosts.
                    super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar12 = *(int *)((long)&pGVar15->n_rounds_revive + lVar17);
          if (iVar12 == 1) {
            *(undefined8 *)((long)&(pGVar15->super_Agent_State).pos.i + lVar17) =
                 *(undefined8 *)((long)&(pGVar15->initial_pos).i + lVar17);
            *(undefined4 *)((long)&pGVar15->n_rounds_revive + lVar17) = 0;
          }
          else {
            ghost_00 = (Ghost_State *)((long)&(pGVar15->super_Agent_State).pos.i + lVar17);
            if (iVar12 == 0) {
              pAVar6 = ppAVar5[uVar14];
              iVar12 = (**pAVar6->_vptr_Agent)(pAVar6,this_00,uVar14 & 0xffffffff);
              if ((*(int *)((long)&(pGVar15->super_Agent_State).dir.i + lVar17) == iVar12) &&
                 (*(int *)((long)&(pGVar15->super_Agent_State).dir.j + lVar17) == extraout_var_00))
              {
                fVar20 = ghost_speed(this,(int)uVar14);
                fVar20 = fVar20 + *(float *)((long)&(pGVar15->super_Agent_State).step + lVar17);
                *(float *)((long)&(pGVar15->super_Agent_State).step + lVar17) = fVar20;
                if (1.0 <= fVar20) {
                  *(float *)((long)&(pGVar15->super_Agent_State).step + lVar17) = fVar20 + -1.0;
                  iVar12 = *(int *)((long)&(pGVar15->super_Agent_State).pos.i + lVar17) + iVar12;
                  iVar11 = extraout_var_00 +
                           *(int *)((long)&(pGVar15->super_Agent_State).pos.j + lVar17);
                  if (*(char *)(*(long *)&(this->state).maze.t.
                                          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[iVar12].
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data + (long)iVar11) == '%') {
                    sprintf(str,"Ghost #%d at [%d,%d] crashes with wall",uVar14 & 0xffffffff);
                    poVar13 = std::operator<<((ostream *)&std::cout,"Debug[");
                    poVar13 = std::operator<<(poVar13,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                             );
                    poVar13 = std::operator<<(poVar13,"][");
                    poVar13 = std::operator<<(poVar13,"play");
                    poVar13 = std::operator<<(poVar13,"][Line ");
                    poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0x10c);
                    poVar13 = std::operator<<(poVar13,"] ");
                    poVar13 = std::operator<<(poVar13,str);
                    std::endl<char,std::char_traits<char>>(poVar13);
                  }
                  else {
                    *(int *)((long)&(pGVar15->super_Agent_State).pos.i + lVar17) = iVar12;
                    *(int *)((long)&(pGVar15->super_Agent_State).pos.j + lVar17) = iVar11;
                    if ((((this->state).pacman.pos.i == iVar12) &&
                        ((this->state).pacman.pos.j == iVar11)) &&
                       (bVar10 = game_over_on_collision(this,ghost_00), bVar10)) goto LAB_0010920c;
                  }
                }
              }
              else {
                fVar20 = *(float *)((long)&(pGVar15->super_Agent_State).step + lVar17);
                fVar21 = ghost_speed(this,(int)uVar14);
                *(float *)((long)&(pGVar15->super_Agent_State).step + lVar17) =
                     fVar21 * (1.0 - fVar20);
                *(int *)((long)&(pGVar15->super_Agent_State).dir.i + lVar17) = iVar12;
                *(int *)((long)&(pGVar15->super_Agent_State).dir.j + lVar17) = extraout_var_00;
              }
            }
            else {
              ghost_00->n_rounds_revive = iVar12 + -1;
            }
          }
          *(Position *)
           ((long)&(((this->state).ghosts.
                     super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_Agent_State).prev.i + lVar17) =
               ghost_previous_pos.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
          uVar14 = uVar14 + 1;
          lVar17 = lVar17 + 0x44;
        }
        (this->state).pacman.prev.i = PVar4.i;
        (this->state).pacman.prev.j = PVar4.j;
        if (Arguments::plays == 1) {
          poVar13 = operator<<((ostream *)&std::cout,this_00);
          std::endl<char,std::char_traits<char>>(poVar13);
        }
        std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
                  (&ghost_previous_pos.super__Vector_base<Position,_std::allocator<Position>_>);
      }
      goto LAB_00109216;
    }
    builtin_strncpy(str,"Try to play without an agent",0x1d);
    poVar13 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar13 = std::operator<<(poVar13,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                             );
    poVar13 = std::operator<<(poVar13,"][");
    poVar13 = std::operator<<(poVar13,"play");
    poVar13 = std::operator<<(poVar13,"][Line ");
    iVar12 = 0xac;
  }
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar12);
  poVar13 = std::operator<<(poVar13,"] ");
  poVar13 = std::operator<<(poVar13,str);
  std::endl<char,std::char_traits<char>>(poVar13);
LAB_00109498:
  exit(1);
code_r0x00108d4c:
  bVar10 = game_over_on_collision
                     (this,(this->state).ghosts.
                           super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                           super__Vector_impl_data._M_start + *piVar16);
  piVar9 = piVar16 + 1;
  if (bVar10) {
LAB_001091f9:
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&ghosts_pos.super__Vector_base<int,_std::allocator<int>_>);
    if (piVar16 == piVar8) goto LAB_00108dab;
    goto LAB_0010920c;
  }
  goto LAB_00108d40;
LAB_0010920c:
  std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
            (&ghost_previous_pos.super__Vector_base<Position,_std::allocator<Position>_>);
LAB_00109216:
  if (Arguments::plays == 1) {
    poVar13 = operator<<((ostream *)&std::cout,this_00);
    std::endl<char,std::char_traits<char>>(poVar13);
    pcVar19 = "WON";
    if (this->game_over != false) {
      pcVar19 = "LOST";
    }
    poVar13 = std::operator<<((ostream *)&std::cout,pcVar19);
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  bVar10 = this->game_over;
  (this->result).won = (bool)(bVar10 ^ 1);
  (this->result).completion =
       1.0 - (double)((this->state).n_powerpills_left + (this->state).n_normal_pills_left) /
             (double)State::total_pills;
  (*this->pacman->_vptr_Agent[1])(this->pacman,(ulong)(bVar10 == false));
  return &this->result;
}

Assistant:

GameResult& play() {
        ensure(loaded_maze, "Try to play without a loaded maze");
        ensure(pacman != NULL, "Try to play without an agent");

        if (Arguments::plays == 1) cout << state << endl;

        while (state.n_powerpills_left + state.n_normal_pills_left > 0) { // break if game_over
            if (Arguments::plays == 1) {
                cout.flush();
                usleep(Arguments::visualization_speed);
            }

            update_ghost_states();

            ++state.round;

            state.n_rounds_powerpill = max(0, state.n_rounds_powerpill - 1);

            Direction pacman_direction = pacman->take_action(state, 0);

            Position pacman_previous_pos = state.pacman.pos;
            vector<Position> ghost_previous_pos(state.n_ghosts);
            for (int i = 0; i < state.n_ghosts; ++i) ghost_previous_pos[i] = state.ghosts[i].pos;

            // TODO: Maybe process movements stochastically to guarantee equality?

            if (state.pacman.dir == pacman_direction) {
                state.pacman.step += Arguments::pacman_speed;

                if (state.pacman.step >= 1) {
                    --state.pacman.step;

                    Position next_pos = state.pacman.pos.move_destination(pacman_direction);
                    char cell_content = state.maze[next_pos.i][next_pos.j];


                    if (cell_content == State::WALL) {
                        _debug("Pacman crashes with wall");
                    }
                    else if (cell_content == State::SPAWN_AREA) {
                        _debug("Pacman crashes with spawn area");
                        assert(false);
                    }
                    else {
                        state.pacman.pos.move(pacman_direction);

                        vector<int> ghosts_pos = state.ghosts_in_position(next_pos);

                        for (int ghost_id : ghosts_pos)
                            if (game_over_on_collision(state.ghosts[ghost_id]))
                                goto end;

                        switch(cell_content) {
                            case State::PILL:
                                state.maze[next_pos.i][next_pos.j] = State::FREE;
                                --state.n_normal_pills_left;
                                state.pills.erase(PathMagic::id(next_pos));
                                pacman->notify_eaten_pill();
                                break;
                            case State::POWER_PILL:
                                state.maze[next_pos.i][next_pos.j] = State::FREE;
                                --state.n_powerpills_left;
                                state.pills.erase(PathMagic::id(next_pos));
                                state.powerpills.erase(PathMagic::id(next_pos));
                                pacman->notify_eaten_powerpill();

                                for (Ghost_State& ghost : state.ghosts) ghost.maybe_scared = true;

                                state.n_rounds_powerpill = Arguments::n_rounds_powerpill;
                                break;
                            case State::FREE: break;
                            default: ensure(false, "Invalid cell_content character '%c'", cell_content);
                        }
                    }
                }
            }
            else {
                pacman->notify_reverse_direction();
                state.pacman.step = (1 - state.pacman.step)*Arguments::pacman_speed;
                state.pacman.dir = pacman_direction;
            }

            for (int i = 0; i < min(1 + state.round/Arguments::n_rounds_between_ghosts_start, (int) ghosts.size()); ++i) {
                Ghost_State& ghost = state.ghosts[i];

                if (ghost.is_alive()) {
                    Direction ghost_direction = ghosts[i]->take_action(state, i);

                    if (ghost_direction == ghost.dir) {
                        ghost.step += ghost_speed(i);

                        if (ghost.step >= 1) {
                            --ghost.step;

                            Position next_pos = ghost.pos.move_destination(ghost_direction);
                            char cell_content = state.maze[next_pos.i][next_pos.j];

                            if (cell_content == State::WALL) {
                                _debug("Ghost #%d at [%d,%d] crashes with wall", i, ghost.pos.i, ghost.pos.j);
                            }
                            else {
                                ghost.pos.move(ghost_direction);

                                if (state.pacman.pos == next_pos and game_over_on_collision(ghost))
                                    goto end;
                            }
                        }
                    }
                    else {
                        ghost.step = (1 - ghost.step)*ghost_speed(i);
                        ghost.dir = ghost_direction;
                    }
                }
                else if (ghost.n_rounds_revive == 1) {
                    ghost.pos = ghost.initial_pos;
                    ghost.n_rounds_revive = 0;
                }
                else {
                    --ghost.n_rounds_revive;
                }

                state.ghosts[i].prev = ghost_previous_pos[i];
            }

            state.pacman.prev = pacman_previous_pos;

            if (Arguments::plays == 1) cout << state << endl;
        }

        end:

        if (Arguments::plays == 1) {
            cout << state << endl;
            cout << (game_over ? "LOST" : "WON") << endl;
        }

        this->result.won = not game_over;
        this->result.completion = 1 - (state.n_normal_pills_left + state.n_powerpills_left)/double(state.total_pills);
        pacman->notify_game_result(this->result.won);
        return this->result;
    }